

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateConstantBool(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  uint32_t uVar1;
  Op OVar2;
  DiagnosticStream *pDVar3;
  string local_228;
  char *local_208;
  DiagnosticStream local_200;
  Instruction *local_28;
  Instruction *type;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  type = inst;
  inst_local = (Instruction *)_;
  uVar1 = Instruction::type_id(inst);
  local_28 = ValidationState_t::FindDef(_,uVar1);
  if ((local_28 != (Instruction *)0x0) &&
     (OVar2 = Instruction::opcode(local_28), OVar2 == OpTypeBool)) {
    return SPV_SUCCESS;
  }
  ValidationState_t::diag(&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,type);
  pDVar3 = DiagnosticStream::operator<<(&local_200,(char (*) [3])0x3df74b);
  OVar2 = Instruction::opcode(type);
  local_208 = spvOpcodeString(OVar2);
  pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_208);
  pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [19])0x3e4270);
  this = inst_local;
  uVar1 = Instruction::type_id(type);
  ValidationState_t::getIdName_abi_cxx11_(&local_228,(ValidationState_t *)this,uVar1);
  pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_228);
  pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [24])" is not a boolean type.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
  std::__cxx11::string::~string((string *)&local_228);
  DiagnosticStream::~DiagnosticStream(&local_200);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateConstantBool(ValidationState_t& _,
                                  const Instruction* inst) {
  auto type = _.FindDef(inst->type_id());
  if (!type || type->opcode() != spv::Op::OpTypeBool) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Op" << spvOpcodeString(inst->opcode()) << " Result Type <id> "
           << _.getIdName(inst->type_id()) << " is not a boolean type.";
  }

  return SPV_SUCCESS;
}